

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

int stable_grail_bin_search_left(int **arr,int len,int **key)

{
  int iVar1;
  int b;
  int iVar2;
  
  iVar2 = -1;
  while (iVar1 = iVar2, iVar1 < len + -1) {
    iVar2 = (len - iVar1 >> 1) + iVar1;
    if (**key <= *arr[iVar2]) {
      len = iVar2;
      iVar2 = iVar1;
    }
  }
  return len;
}

Assistant:

static int GRAIL_BIN_SEARCH_LEFT(SORT_TYPE *arr, int len, SORT_TYPE *key) {
  int a = -1, b = len, c;

  while (a < b - 1) {
    c = a + ((b - a) >> 1);

    if (SORT_CMP_A(arr + c, key) >= 0) {
      b = c;
    } else {
      a = c;
    }
  }

  return b;
}